

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

Bool tidyNodeGetText(TidyDoc tdoc,TidyNode tnod,TidyBuffer *outbuf)

{
  StreamOut *pSVar1;
  Bool xhtmlOut;
  Bool xmlOut;
  StreamOut *out;
  uint nl;
  uint outenc;
  Node *nimp;
  TidyDocImpl *doc;
  TidyBuffer *outbuf_local;
  TidyNode tnod_local;
  TidyDoc tdoc_local;
  
  if (((tdoc == (TidyDoc)0x0) || (tnod == (TidyNode)0x0)) || (outbuf == (TidyBuffer *)0x0)) {
    tdoc_local._4_4_ = no;
  }
  else {
    pSVar1 = prvTidyBufferOutput((TidyDocImpl *)tdoc,outbuf,(int)*(undefined8 *)(tdoc + 0x28),
                                 (uint)*(undefined8 *)(tdoc + 0x2a));
    *(StreamOut **)(tdoc + 0xcd0) = pSVar1;
    if (((int)*(undefined8 *)(tdoc + 0x4e) == 0) || ((int)*(undefined8 *)(tdoc + 0x50) != 0)) {
      prvTidyPPrintTree((TidyDocImpl *)tdoc,0,0,(Node *)tnod);
    }
    else {
      prvTidyPPrintXMLTree((TidyDocImpl *)tdoc,0,0,(Node *)tnod);
    }
    prvTidyPFlushLine((TidyDocImpl *)tdoc,0);
    *(undefined8 *)(tdoc + 0xcd0) = 0;
    (**(code **)(**(long **)(tdoc + 0xcea) + 0x10))(*(undefined8 *)(tdoc + 0xcea),pSVar1);
    tdoc_local._4_4_ = yes;
  }
  return tdoc_local._4_4_;
}

Assistant:

Bool TIDY_CALL  tidyNodeGetText( TidyDoc tdoc, TidyNode tnod, TidyBuffer* outbuf )
{
  TidyDocImpl* doc = tidyDocToImpl( tdoc );
  Node* nimp = tidyNodeToImpl( tnod );
  if ( doc && nimp && outbuf )
  {
      uint outenc     = cfg( doc, TidyOutCharEncoding );
      uint nl         = cfg( doc, TidyNewline );
      StreamOut* out  = TY_(BufferOutput)( doc, outbuf, outenc, nl );
      Bool xmlOut     = cfgBool( doc, TidyXmlOut );
      Bool xhtmlOut   = cfgBool( doc, TidyXhtmlOut );

      doc->docOut = out;
      if ( xmlOut && !xhtmlOut )
          TY_(PPrintXMLTree)( doc, NORMAL, 0, nimp );
      else
          TY_(PPrintTree)( doc, NORMAL, 0, nimp );

      TY_(PFlushLine)( doc, 0 );
      doc->docOut = NULL;

      TidyDocFree( doc, out );
      return yes;
  }
  return no;
}